

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,JointPolicyPureVectorForClusteredBG *this)

{
  int *piVar1;
  JPPVfCBG_constPtr *pJVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_type __n;
  PlanningUnitDecPOMDPDiscrete *pPVar6;
  sp_counted_base *psVar7;
  bool bVar8;
  char cVar9;
  element_type *peVar10;
  sp_counted_base *psVar11;
  ostream *poVar12;
  Interface_ProblemToPolicyDiscretePure *pIVar13;
  ulong uVar14;
  undefined8 *puVar15;
  Index ts;
  ulong uVar16;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  stringstream ss;
  JPPVfCBG_constPtr local_258;
  undefined1 local_248 [24];
  shared_count sStack_230;
  element_type *local_228;
  shared_count sStack_220;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  local_218;
  PlanningUnitDecPOMDPDiscrete *local_200;
  JointPolicyPureVectorForClusteredBG *local_1f8;
  string *local_1f0;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_1e8;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_1d0;
  stringstream local_1b8 [16];
  shared_count local_1a8 [14];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"JointPolicyPureVectorForClusteredBG:SoftPrint",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  sVar5 = (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
          super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"JointPolicyPureVectorForClusteredBG, depth ",0x2b);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  cVar9 = (char)(ostream *)local_1a8;
  if (sVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"empty policy!",0xd);
    uVar3 = local_1a8[0].pi_[-2].use_count_;
    std::ios::widen((char)uVar3 + cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
  }
  else {
    JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared
              ((JointPolicyDiscretePure *)&local_258);
    if (local_258.px == (element_type *)0x0) {
      pIVar13 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure
                          ((JointPolicyDiscretePure *)this);
      boost::detail::shared_count::~shared_count(&local_258.pn);
      if (pIVar13 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar15 = &PTR__E_0059bd80;
        puVar15[1] = puVar15 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar15 + 1),
                   "JointPolicyPureVectorForClusteredBG:SoftPrint - Error!!! PTPDP==0, but depth>0",
                   "");
        __cxa_throw(puVar15,&E::typeinfo,E::~E);
      }
    }
    else {
      boost::detail::shared_count::~shared_count(&local_258.pn);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Improve printing this (clustered) policy..., the below still takes exponential space... "
               ,0x58);
    uVar4 = local_1a8[0].pi_[-2].use_count_;
    std::ios::widen((char)uVar4 + cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    __n = (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
          super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
    pPVar6 = (((this->_m_bg).px)->super_BayesianGameForDecPOMDPStage)._m_pu;
    local_248._16_8_ = (element_type *)0x0;
    sStack_230.pi_ = (sp_counted_base *)0x0;
    std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
    vector(&local_218,__n,(allocator_type *)&local_258);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector(&local_1e8,__n,(allocator_type *)&local_258);
    local_200 = pPVar6;
    local_1f8 = this;
    local_1f0 = __return_storage_ptr__;
    if (__n == 0) {
      ts = 0;
    }
    else {
      uVar14 = 0;
      uVar16 = 1;
      do {
        psVar7 = (this->_m_bg).pn.pi_;
        peVar10 = (this->_m_bg).px;
        psVar11 = (this->_m_bg).pn.pi_;
        if (psVar7 != (sp_counted_base *)0x0) {
          LOCK();
          piVar1 = &psVar7->use_count_;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_228 = (element_type *)0x0;
        sStack_220.pi_ = (sp_counted_base *)0x0;
        local_258.pn.pi_ = sStack_230.pi_;
        local_258.px = (element_type *)local_248._16_8_;
        local_248._16_8_ = peVar10;
        sStack_230.pi_ = psVar11;
        boost::detail::shared_count::~shared_count(&local_258.pn);
        boost::detail::shared_count::~shared_count(&sStack_220);
        ts = (Index)(~uVar14 + __n);
        uVar14 = ~uVar14 + __n & 0xffffffff;
        if (((ulong)((long)local_218.
                           super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_218.
                           super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar14) ||
           (((_func_int ***)
            local_218.
            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            ._M_impl.super__Vector_impl_data._M_start)[uVar14] = (_func_int **)this,
           (ulong)((long)local_1e8.
                         super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1e8.
                         super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar14)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                  ((shared_ptr<const_BayesianGameWithClusterInfo> *)
                   (local_1e8.
                    super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14),
                   (shared_ptr<const_BayesianGameWithClusterInfo> *)(local_248 + 0x10));
        if (ts != 0) {
          psVar7 = (this->_m_prevJPolBG).pn.pi_;
          pJVar2 = &this->_m_prevJPolBG;
          this = pJVar2->px;
          local_258 = *pJVar2;
          if (psVar7 != (sp_counted_base *)0x0) {
            LOCK();
            piVar1 = &psVar7->use_count_;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          boost::detail::shared_count::~shared_count(&local_258.pn);
          if (this == (JointPolicyPureVectorForClusteredBG *)0x0) {
            psVar7 = (((BayesianGameForDecPOMDPStage *)local_248._16_8_)->
                     super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
            local_228 = (((BayesianGameForDecPOMDPStage *)local_248._16_8_)->
                        super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
            sStack_220.pi_ =
                 (((BayesianGameForDecPOMDPStage *)local_248._16_8_)->
                 super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
            if (psVar7 != (sp_counted_base *)0x0) {
              LOCK();
              piVar1 = &psVar7->use_count_;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            local_258 = (JPPVfCBG_constPtr)(ZEXT816(0) << 0x20);
            boost::detail::shared_count::~shared_count(&local_258.pn);
            if (local_228 == (element_type *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"JointPolicyPureVectorForClusteredBG::SoftPrint",0x2e
                        );
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," t=",3);
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,", but no past joint policy? (jp ==0)",0x24);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"The following joint policy was used for stages 0...",
                         0x33);
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," :",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              (*(local_228->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                super_JointPolicy._vptr_JointPolicy[6])(&local_258);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_258.px,(long)local_258.pn.pi_);
              if (local_258.px != (element_type *)local_248) {
                operator_delete(local_258.px,local_248._0_8_ + 1);
              }
            }
            boost::detail::shared_count::~shared_count(&sStack_220);
            break;
          }
        }
        bVar8 = uVar16 < __n;
        uVar14 = uVar16;
        uVar16 = (ulong)((int)uVar16 + 1);
      } while (bVar8);
    }
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector(&local_1d0,&local_1e8);
    __return_storage_ptr__ = local_1f0;
    StartRecursiveSoftPrintPerAgent
              (local_1f8,local_200,(stringstream *)local_1b8,ts,(int)__n - 1,&local_218,&local_1d0);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector(&local_1d0);
    std::__cxx11::stringbuf::str();
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector(&local_1e8);
    if ((sp_counted_base *)
        local_218.
        super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (sp_counted_base *)0x0) {
      operator_delete(local_218.
                      super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_218.
                            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.
                            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    boost::detail::shared_count::~shared_count(&sStack_230);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrint() const
{
    cout << "JointPolicyPureVectorForClusteredBG:SoftPrint"<<endl;
    size_t depth = GetDepth();
    stringstream ss;
    ss << "JointPolicyPureVectorForClusteredBG, depth " 
       << GetDepth() << endl;
    if(depth == 0)
    {
        ss << "empty policy!"<< endl;
        return(ss.str());
    }

    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrint - Error!!! PTPDP==0, but depth>0");
            
    ss << "Improve printing this (clustered) policy..., the below still takes exponential space... "<<endl;
/*    for(
            Index agentI = 0; 
            agentI <    static_cast< vector<PolicyPureVector*>::size_type> 
                            (PTPDP->GetNrAgents());
            agentI++
        )
    {
        ss << "Policy for agent " << agentI << " (index "
           << _m_policyPointerVector.at(agentI)->GetIndex() << "):" << endl
           << _m_policyPointerVector.at(agentI)->SoftPrint();
    }
*/    
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    size_t h = this->GetDepth();//pu->GetHorizon();
//     JPPVfCBG_constPtr jpolBG = 
//         JPPVfCBG_constPtr(new JointPolicyPureVectorForClusteredBG(*this));
    const JointPolicyPureVectorForClusteredBG *jpolBG=this;
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;

        if( t > 0  )
        {
            jpolBG = jpolBG->GetPrevJPPVfCBG().get();
            if(jpolBG == 0)
            {
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                if(jp != 0)
                {
                    ss << "The following joint policy was used for stages 0..."
                        << t << " :"<< endl;
                    ss << jp->SoftPrint();
                }
                else
                {
                    cerr << "JointPolicyPureVectorForClusteredBG::SoftPrint"
                       <<" t="<<t<<", but no past joint policy? (jp ==0)"<<endl;

                }
                break;
            }

        }
    }
#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>About to start StartRecursiveSoftPrintPerAgent..."<<endl;
#endif
    StartRecursiveSoftPrintPerAgent(pu, ss, t, h-1, jpolBGVec, bgVec);
    return(ss.str());
}